

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O0

void __thiscall
testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::Matcher
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this,char *s)

{
  Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
  *in_stack_ffffffffffffff70;
  allocator<char> local_69;
  string local_68 [8];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::MatcherBase
            (in_stack_ffffffffffffff70);
  *(undefined ***)in_RDI = &PTR__Matcher_00210548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Eq<std::__cxx11::string>(in_RDI);
  Matcher<std::basic_string_view<char,std::char_traits<char>>const&>::
  Matcher<testing::internal::EqMatcher<std::__cxx11::string>,void>
            (in_RSI,(EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_RDI);
  operator=(in_RSI,(Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)in_RDI)
  ;
  ~Matcher((Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)0x1b22b8);
  internal::
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~EqMatcher((EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1b22c2);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

Matcher<const internal::StringView&>::Matcher(const char* s) {
  *this = Eq(std::string(s));
}